

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

timestamp_t * __thiscall duckdb::timestamp_t::operator-=(timestamp_t *this,int64_t *delta)

{
  bool bVar1;
  OutOfRangeException *this_00;
  allocator local_39;
  string local_38;
  
  bVar1 = TrySubtractOperator::Operation<long,long,long>(this->value,*delta,&this->value);
  if (bVar1) {
    return this;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Overflow in timestamp decrement",&local_39);
  OutOfRangeException::OutOfRangeException(this_00,&local_38);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_t &timestamp_t::operator-=(const int64_t &delta) {
	if (!TrySubtractOperator::Operation(value, delta, value)) {
		throw OutOfRangeException("Overflow in timestamp decrement");
	}
	return *this;
}